

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

void __thiscall
IR::PropertySymOpnd::Init
          (PropertySymOpnd *this,uint inlineCacheIndex,intptr_t runtimeInlineCache,
          JITTimePolymorphicInlineCache *runtimePolymorphicInlineCache,
          ObjTypeSpecFldInfo *objTypeSpecFldInfo,byte polyCacheUtil)

{
  byte polyCacheUtil_local;
  ObjTypeSpecFldInfo *objTypeSpecFldInfo_local;
  JITTimePolymorphicInlineCache *runtimePolymorphicInlineCache_local;
  intptr_t runtimeInlineCache_local;
  uint inlineCacheIndex_local;
  PropertySymOpnd *this_local;
  
  this->m_inlineCacheIndex = inlineCacheIndex;
  this->m_runtimeInlineCache = runtimeInlineCache;
  this->m_runtimePolymorphicInlineCache = runtimePolymorphicInlineCache;
  this->m_polyCacheUtil = polyCacheUtil;
  SetObjTypeSpecFldInfo(this,objTypeSpecFldInfo);
  Opnd::SetIsJITOptimizedReg((Opnd *)this,false);
  return;
}

Assistant:

void
PropertySymOpnd::Init(uint inlineCacheIndex, intptr_t runtimeInlineCache, JITTimePolymorphicInlineCache * runtimePolymorphicInlineCache, ObjTypeSpecFldInfo* objTypeSpecFldInfo, byte polyCacheUtil)
{
    this->m_inlineCacheIndex = inlineCacheIndex;
    this->m_runtimeInlineCache = runtimeInlineCache;
    this->m_runtimePolymorphicInlineCache = runtimePolymorphicInlineCache;
    this->m_polyCacheUtil = polyCacheUtil;
    this->SetObjTypeSpecFldInfo(objTypeSpecFldInfo);

    this->SetIsJITOptimizedReg(false);
}